

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall
semver::detail::version_parser::parse<long,long,long>
          (version_parser *this,version<long,_long,_long> *out)

{
  bool bVar1;
  char *ptr;
  char *ptr_00;
  token_stream *ptVar2;
  from_chars_result fVar3;
  undefined4 uStack_8c;
  undefined4 uStack_7c;
  undefined4 uStack_6c;
  undefined4 uStack_4c;
  undefined1 local_38 [8];
  from_chars_result result;
  version<long,_long,_long> *out_local;
  version_parser *this_local;
  errc local_10;
  
  result.super_from_chars_result._8_8_ = out;
  version<long,_long,_long>::clear(out);
  fVar3 = parse_number<long>(this,(long *)result.super_from_chars_result._8_8_);
  local_38 = (undefined1  [8])fVar3.super_from_chars_result.ptr;
  result.super_from_chars_result.ptr =
       (char *)CONCAT44(result.super_from_chars_result.ptr._4_4_,fVar3.super_from_chars_result.ec);
  bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)local_38);
  if (bVar1) {
    ptVar2 = (token_stream *)0x2;
    bVar1 = token_stream::consume(this->stream,dot);
    if (bVar1) {
      fVar3 = parse_number<long>(this,(long *)(result.super_from_chars_result._8_8_ + 8));
      local_38 = (undefined1  [8])fVar3.super_from_chars_result.ptr;
      result.super_from_chars_result.ptr =
           (char *)CONCAT44(uStack_4c,fVar3.super_from_chars_result.ec);
      bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)local_38);
      if (bVar1) {
        ptVar2 = (token_stream *)0x2;
        bVar1 = token_stream::consume(this->stream,dot);
        if (bVar1) {
          fVar3 = parse_number<long>(this,(long *)(result.super_from_chars_result._8_8_ + 0x10));
          local_38 = (undefined1  [8])fVar3.super_from_chars_result.ptr;
          result.super_from_chars_result.ptr =
               (char *)CONCAT44(uStack_6c,fVar3.super_from_chars_result.ec);
          bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)local_38);
          if (bVar1) {
            bVar1 = token_stream::advanceIfMatch(this->stream,hyphen);
            if (bVar1) {
              fVar3 = parse_prerelease_tag
                                (this,(string *)(result.super_from_chars_result._8_8_ + 0x18),
                                 (vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                                  *)(result.super_from_chars_result._8_8_ + 0x58));
              local_38 = (undefined1  [8])fVar3.super_from_chars_result.ptr;
              result.super_from_chars_result.ptr =
                   (char *)CONCAT44(uStack_7c,fVar3.super_from_chars_result.ec);
              bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)local_38);
              if (!bVar1) {
                this_local = (version_parser *)local_38;
                local_10 = (errc)result.super_from_chars_result.ptr;
                goto LAB_00107c7a;
              }
            }
            bVar1 = token_stream::advanceIfMatch(this->stream,plus);
            if (bVar1) {
              fVar3 = parse_build_metadata
                                (this,(string *)(result.super_from_chars_result._8_8_ + 0x38));
              local_38 = (undefined1  [8])fVar3.super_from_chars_result.ptr;
              result.super_from_chars_result.ptr =
                   (char *)CONCAT44(uStack_8c,fVar3.super_from_chars_result.ec);
              bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)local_38);
              if (!bVar1) {
                this_local = (version_parser *)local_38;
                local_10 = (errc)result.super_from_chars_result.ptr;
                goto LAB_00107c7a;
              }
            }
            this_local = (version_parser *)local_38;
            local_10 = (errc)result.super_from_chars_result.ptr;
          }
          else {
            this_local = (version_parser *)local_38;
            local_10 = (errc)result.super_from_chars_result.ptr;
          }
        }
        else {
          token_stream::previous((token *)this->stream,ptVar2);
          fVar3 = failure(ptr_00,invalid_argument);
          this_local = (version_parser *)fVar3.super_from_chars_result.ptr;
          local_10 = fVar3.super_from_chars_result.ec;
        }
      }
      else {
        this_local = (version_parser *)local_38;
        local_10 = (errc)result.super_from_chars_result.ptr;
      }
    }
    else {
      token_stream::previous((token *)this->stream,ptVar2);
      fVar3 = failure(ptr,invalid_argument);
      this_local = (version_parser *)fVar3.super_from_chars_result.ptr;
      local_10 = fVar3.super_from_chars_result.ec;
    }
  }
  else {
    this_local = (version_parser *)local_38;
    local_10 = (errc)result.super_from_chars_result.ptr;
  }
LAB_00107c7a:
  fVar3.super_from_chars_result.ec = local_10;
  fVar3.super_from_chars_result.ptr = (char *)this_local;
  fVar3.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar3.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(version<I1, I2, I3>& out) noexcept {
    out.clear();

    from_chars_result result = parse_number(out.major_); 
    if (!result) {
      return result;
    }

    if (!stream.consume(token_type::dot)) {
      return failure(stream.previous().lexeme);
    }

    result = parse_number(out.minor_);
    if (!result) {
      return result;
    }

    if (!stream.consume(token_type::dot)) {
      return failure(stream.previous().lexeme);
    }

    result = parse_number(out.patch_);
    if (!result) {
      return result;
    }

    if (stream.advanceIfMatch(token_type::hyphen)) {
      result = parse_prerelease_tag(out.prerelease_tag_, out.prerelease_identifiers);
      if (!result) {
        return result;
      }
    }

    if (stream.advanceIfMatch(token_type::plus)) {
      result = parse_build_metadata(out.build_metadata_);
      if (!result) {
        return result;
      }
    }

    return result;
  }